

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderLoop
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,LoopTag *tag,
          SizeT *offset)

{
  StringView<char> *key;
  ValueType VVar1;
  uint uVar2;
  uint uVar3;
  SizeT SVar4;
  StringStream<char> *this_00;
  char *pcVar5;
  TagBit *tag_00;
  LoopItem *pLVar6;
  bool bVar7;
  byte bVar8;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar9;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar10;
  Value<char> *pVVar11;
  SizeT SVar12;
  SizeT SVar13;
  uint size;
  Value<char> grouped_set;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_68;
  undefined1 local_58;
  LoopItem local_48;
  
  local_58 = 0;
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  this_00 = this->stream_;
  uVar2 = *offset;
  SVar12 = this_00->length_;
  size = tag->Offset - uVar2;
  pcVar5 = this->content_;
  uVar3 = SVar12 + size;
  if (this_00->capacity_ < uVar3) {
    StringStream<char>::expand(this_00,uVar3);
    SVar12 = this_00->length_;
  }
  Memory::Copy<unsigned_int>(this_00->storage_ + SVar12,pcVar5 + uVar2,size);
  this_00->length_ = uVar3;
  *offset = tag->EndOffset + 7;
  if ((tag->Set).Length == 0) {
    paVar9 = &this->value_->field_0;
  }
  else {
    paVar9 = &getValue(this,&tag->Set)->field_0;
  }
  if (paVar9 != (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0) {
    paVar10 = paVar9;
    if (tag->GroupLength != 0) {
      paVar10 = &local_68;
      bVar7 = Value<char>::GroupBy
                        ((Value<char> *)&paVar9->array_,(Value<char> *)&paVar10->array_,
                         this->content_ + (ulong)tag->GroupOffset + (ulong)tag->Offset,
                         (uint)tag->GroupLength);
      if (!bVar7) goto LAB_001259a8;
    }
    bVar8 = tag->Options;
    paVar9 = paVar10;
    if (1 < bVar8) {
      if ((tag->GroupLength == '\0') && (paVar9 = &local_68, &local_68 != paVar10)) {
        Value<char>::reset((Value<char> *)&local_68.array_);
        Value<char>::copyValue((Value<char> *)&local_68.array_,(Value<char> *)&paVar10->array_);
        bVar8 = tag->Options;
      }
      Value<char>::Sort((Value<char> *)&local_68.array_,(bool)((bVar8 & 2) >> 1));
    }
    uVar3 = (tag->SubTags).index_;
    tag_00 = (tag->SubTags).storage_;
    SVar12 = (uint)tag->ContentOffset + tag->Offset;
    for (paVar10 = paVar9; *(byte *)(paVar10 + 1) == 1;
        paVar10 = &((paVar10->array_).storage_)->field_0) {
    }
    if (*(byte *)(paVar10 + 1) - 2 < 2) {
      SVar4 = (paVar10->object_).
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              .index_;
    }
    else {
      SVar4 = 0;
    }
    if (this->loops_items_->index_ <= (uint)tag->Level) {
      local_48.Value = (Value<char> *)0x0;
      local_48.Key.storage_ = (char *)0x0;
      local_48.Key.length_ = 0;
      local_48.Key._12_4_ = 0;
      Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
      ::operator+=(this->loops_items_,&local_48);
    }
    VVar1 = *(ValueType *)(paVar9 + 1);
    if (VVar1 == ValuePtr) {
      VVar1 = ((paVar9->array_).storage_)->type_;
    }
    if (VVar1 == Object) {
      if (SVar4 != 0) {
        SVar13 = 0;
        do {
          pLVar6 = this->loops_items_->storage_;
          key = &pLVar6[tag->Level].Key;
          Value<char>::SetValueAndKey
                    ((Value<char> *)&paVar9->array_,SVar13,&pLVar6[tag->Level].Value,key);
          if (*(long *)((long)(key + -1) + 8) != 0) {
            render(this,tag_00,tag_00 + uVar3,SVar12,tag->EndOffset);
          }
          SVar13 = SVar13 + 1;
        } while (SVar4 != SVar13);
      }
    }
    else if (SVar4 != 0) {
      SVar13 = 0;
      do {
        pLVar6 = this->loops_items_->storage_;
        bVar8 = tag->Level;
        pVVar11 = Value<char>::GetValue((Value<char> *)&paVar9->array_,SVar13);
        pLVar6[bVar8].Value = pVVar11;
        if (pVVar11 != (Value<char> *)0x0) {
          render(this,tag_00,tag_00 + uVar3,SVar12,tag->EndOffset);
        }
        SVar13 = SVar13 + 1;
      } while (SVar4 != SVar13);
    }
  }
LAB_001259a8:
  Value<char>::~Value((Value<char> *)&local_68.array_);
  return;
}

Assistant:

void renderLoop(const LoopTag &tag, SizeT &offset) const {
        Value_T        grouped_set;
        const Value_T *loop_set;

        stream_->Write((content_ + offset), (tag.Offset - offset));
        offset = tag.EndOffset;
        offset += TagPatterns::LoopSuffixLength;

        // Set (Array|Object)
        if (tag.Set.Length != 0) {
            loop_set = getValue(tag.Set);
        } else {
            loop_set = value_;
        }

        if (loop_set != nullptr) {
            // Group
            if (tag.GroupLength != 0) {
                if (!(loop_set->GroupBy(grouped_set, (content_ + tag.Offset + tag.GroupOffset), tag.GroupLength))) {
                    return;
                }

                loop_set = &grouped_set;
            }

            // Sort
            if (tag.Options > SizeT8{1}) {
                if (tag.GroupLength == 0) {
                    grouped_set = *loop_set;
                    loop_set    = &grouped_set;
                }

                grouped_set.Sort((tag.Options & LoopTagOptions::SortAscend) == LoopTagOptions::SortAscend);
            }

            // Stage 4: Render
            const TagBit *s_tag          = tag.SubTags.First();
            const TagBit *s_end          = (s_tag + tag.SubTags.Size());
            const SizeT   content_offset = (tag.Offset + tag.ContentOffset);
            const SizeT   loop_size      = loop_set->Size();
            SizeT         loop_index     = 0;

            if (loops_items_->Size() <= tag.Level) {
                *loops_items_ += LoopItem{};
            }

            if (loop_set->IsObject()) {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    loop_set->SetValueAndKey(loop_index, item.Value, item.Key);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            } else {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    item.Value     = loop_set->GetValue(loop_index);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            }
        }
    }